

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_geometry_device.cpp
# Opt level: O0

void embree::displacementFunction(RTCDisplacementFunctionNArguments *args)

{
  ulong uVar1;
  long in_RDI;
  Vec3fa dP;
  Vec3fa Ng;
  Vec3fa P;
  uint i;
  uint N;
  float *pz;
  float *py;
  float *px;
  float *nz;
  float *ny;
  float *nx;
  undefined1 local_188 [8];
  float in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  undefined8 local_178;
  ulong uStack_170;
  undefined8 local_168;
  ulong uStack_160;
  uint local_158;
  uint local_154;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 *local_108;
  float local_fc;
  undefined1 *local_f8;
  uint local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined8 *local_e0;
  uint local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined8 *local_c8;
  float local_bc;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 *local_60;
  undefined8 local_58;
  ulong uStack_50;
  undefined4 local_48;
  undefined4 local_44;
  uint local_40;
  undefined4 local_3c;
  undefined8 local_38;
  ulong uStack_30;
  undefined4 local_28;
  undefined4 local_24;
  uint local_20;
  undefined4 local_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  float fStack_8;
  
  local_128 = *(long *)(in_RDI + 0x28);
  local_130 = *(long *)(in_RDI + 0x30);
  local_138 = *(long *)(in_RDI + 0x38);
  local_140 = *(long *)(in_RDI + 0x40);
  local_148 = *(long *)(in_RDI + 0x48);
  local_150 = *(long *)(in_RDI + 0x50);
  local_154 = *(uint *)(in_RDI + 0x58);
  for (local_158 = 0; local_158 < local_154; local_158 = local_158 + 1) {
    uVar1 = (ulong)local_158;
    local_e4 = *(undefined4 *)(local_140 + uVar1 * 4);
    local_e8 = *(undefined4 *)(local_148 + uVar1 * 4);
    local_ec = *(uint *)(local_150 + uVar1 * 4);
    local_e0 = &local_168;
    local_1c = 0;
    local_38 = CONCAT44(local_e8,local_e4);
    uStack_30 = (ulong)local_ec;
    uVar1 = (ulong)local_158;
    local_cc = *(undefined4 *)(local_128 + uVar1 * 4);
    local_d0 = *(undefined4 *)(local_130 + uVar1 * 4);
    local_d4 = *(uint *)(local_138 + uVar1 * 4);
    local_3c = 0;
    local_58 = CONCAT44(local_d0,local_cc);
    uStack_50 = (ulong)local_d4;
    local_c8 = &local_178;
    local_48 = local_cc;
    local_44 = local_d0;
    local_40 = local_d4;
    local_28 = local_e4;
    local_24 = local_e8;
    local_20 = local_ec;
    local_178 = local_58;
    uStack_170 = uStack_50;
    local_168 = local_38;
    uStack_160 = uStack_30;
    local_fc = displacement((Vec3fa *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80))
    ;
    local_f8 = local_188;
    local_b8 = &local_118;
    local_88 = CONCAT44(local_fc,local_fc);
    uStack_80 = CONCAT44(local_fc,local_fc);
    local_a0 = local_188;
    local_a8 = &local_118;
    local_98._0_4_ = (float)local_178;
    local_98._4_4_ = (float)((ulong)local_178 >> 0x20);
    uStack_90._0_4_ = (float)uStack_170;
    uStack_90._4_4_ = (float)(uStack_170 >> 0x20);
    local_78 = local_fc * (float)local_98;
    fStack_74 = local_fc * local_98._4_4_;
    in_stack_fffffffffffffe80 = local_fc * (float)uStack_90;
    in_stack_fffffffffffffe84 = local_fc * uStack_90._4_4_;
    local_60 = local_188;
    *(float *)(local_140 + (ulong)local_158 * 4) =
         local_78 + *(float *)(local_140 + (ulong)local_158 * 4);
    *(float *)(local_148 + (ulong)local_158 * 4) =
         fStack_74 + *(float *)(local_148 + (ulong)local_158 * 4);
    *(float *)(local_150 + (ulong)local_158 * 4) =
         in_stack_fffffffffffffe80 + *(float *)(local_150 + (ulong)local_158 * 4);
    local_108 = &local_178;
    local_bc = local_fc;
    local_b0 = &local_178;
    local_98 = local_178;
    uStack_90 = uStack_170;
    fStack_70 = in_stack_fffffffffffffe80;
    fStack_6c = in_stack_fffffffffffffe84;
    local_18 = local_fc;
    fStack_14 = local_fc;
    fStack_10 = local_fc;
    fStack_c = local_fc;
    fStack_8 = local_fc;
    local_118 = local_88;
    uStack_110 = uStack_80;
  }
  return;
}

Assistant:

void displacementFunction(const struct RTCDisplacementFunctionNArguments* args)
{
  const float* nx = args->Ng_x;
  const float* ny = args->Ng_y;
  const float* nz = args->Ng_z;
  float* px = args->P_x;
  float* py = args->P_y;
  float* pz = args->P_z;
  unsigned int N = args->N;
                                   
  for (unsigned int i=0; i<N; i++) {
    const Vec3fa P = Vec3fa(px[i],py[i],pz[i]);
    const Vec3fa Ng = Vec3fa(nx[i],ny[i],nz[i]);
    const Vec3fa dP = displacement(P)*Ng;
    px[i] += dP.x; py[i] += dP.y; pz[i] += dP.z;
  }
}